

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hiredis.c
# Opt level: O3

void * createNilObject(redisReadTask *task)

{
  int iVar1;
  int *piVar2;
  undefined4 *puVar3;
  
  puVar3 = (undefined4 *)calloc(1,0x38);
  if (puVar3 != (undefined4 *)0x0) {
    *puVar3 = 4;
    if (task->parent != (redisReadTask *)0x0) {
      piVar2 = (int *)task->parent->obj;
      iVar1 = *piVar2;
      if ((1 < iVar1 - 9U) && (iVar1 != 2)) {
        __assert_fail("parent->type == REDIS_REPLY_ARRAY || parent->type == REDIS_REPLY_MAP || parent->type == REDIS_REPLY_SET"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/DGuco[P]exhiredis/hiredis/hiredis.c"
                      ,0xef,"void *createNilObject(const redisReadTask *)");
      }
      *(undefined4 **)(*(long *)(piVar2 + 0xc) + (long)task->idx * 8) = puVar3;
    }
  }
  return puVar3;
}

Assistant:

static void *createNilObject(const redisReadTask *task) {
    redisReply *r, *parent;

    r = createReplyObject(REDIS_REPLY_NIL);
    if (r == NULL)
        return NULL;

    if (task->parent) {
        parent = task->parent->obj;
        assert(parent->type == REDIS_REPLY_ARRAY ||
               parent->type == REDIS_REPLY_MAP ||
               parent->type == REDIS_REPLY_SET);
        parent->element[task->idx] = r;
    }
    return r;
}